

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

Dam_Man_t * Dam_ManAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  Dam_Man_t *pDVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  abctime aVar5;
  timespec ts;
  timespec local_28;
  
  pDVar2 = (Dam_Man_t *)calloc(1,0x78);
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    aVar5 = -1;
  }
  else {
    aVar5 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  pDVar2->clkStart = aVar5;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pDVar2->vVisit = pVVar3;
  pDVar2->pGia = pGia;
  return pDVar2;
}

Assistant:

Dam_Man_t * Dam_ManAlloc( Gia_Man_t * pGia )
{
    Dam_Man_t * p;
    p = ABC_CALLOC( Dam_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->vVisit = Vec_IntAlloc( 1000 );
    p->pGia = pGia;
    return p;
}